

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::write_file(NaVector *this,NaDataFile *pDF)

{
  uint uVar1;
  undefined4 *puVar2;
  long *in_RSI;
  long *in_RDI;
  uint i;
  uint local_14;
  
  if (in_RSI == (long *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  local_14 = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDI + 0x30))();
    if (uVar1 <= local_14) break;
    (**(code **)(*in_RSI + 0x30))();
    (**(code **)(*in_RDI + 0x48))(in_RDI,local_14);
    (**(code **)(*in_RSI + 0x10))(in_RSI,0);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void
NaVector::write_file (NaDataFile* pDF) const
{
    if(NULL == pDF)
        throw(na_null_pointer);

    unsigned    i;
    for(i = 0; i < dim(); ++i){
        pDF->AppendRecord();
        pDF->SetValue(get(i));
    }
}